

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IMutableContext *pIVar1;
  int iVar2;
  IStreamingReporter *pIVar3;
  Ptr<const_Catch::IConfig> local_78;
  TestRunStats local_70;
  RunContext *local_10;
  RunContext *this_local;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_001f1818;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_001f1880;
  local_10 = this;
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar2 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])();
  TestRunStats::TestRunStats(&local_70,&this->m_runInfo,&this->m_totals,(bool)((byte)iVar2 & 1));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar3,&local_70);
  TestRunStats::~TestRunStats(&local_70);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,this->m_prevRunner);
  pIVar1 = this->m_context;
  Ptr<const_Catch::IConfig>::Ptr(&local_78,(IConfig *)0x0);
  (*(pIVar1->super_IContext)._vptr_IContext[9])(pIVar1,&local_78);
  Ptr<const_Catch::IConfig>::~Ptr(&local_78);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this->m_prevResultCapture);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,&this->m_prevConfig);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::~vector(&this->m_unfinishedSections);
  AssertionInfo::~AssertionInfo(&this->m_lastAssertionInfo);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_prevConfig);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr(&this->m_config);
  AssertionResult::~AssertionResult(&this->m_lastResult);
  Option<Catch::SectionTracking::TestCaseTracker>::~Option(&this->m_testCaseTracker);
  TestRunInfo::~TestRunInfo(&this->m_runInfo);
  IRunner::~IRunner(&this->super_IRunner);
  IResultCapture::~IResultCapture(&this->super_IResultCapture);
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }